

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BloomFilter.hpp
# Opt level: O2

void __thiscall
supermap::BloomFilter<supermap::Key<1UL>_>::add
          (BloomFilter<supermap::Key<1UL>_> *this,Key<1UL> *value)

{
  XXH64_hash_t *pXVar1;
  uint64_t __n;
  IllegalStateException *this_00;
  unsigned_long *seed;
  XXH64_hash_t *pXVar2;
  reference rVar3;
  allocator<char> local_51;
  string data;
  
  if (((this->elements_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
       ._M_start.super__Bit_iterator_base._M_p ==
       (this->elements_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
       ._M_finish.super__Bit_iterator_base._M_p) &&
     ((this->elements_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_offset == 0)) {
    this_00 = (IllegalStateException *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&data,"Filter size was not reserved or was set to zero",&local_51);
    supermap::IllegalStateException::IllegalStateException(this_00,(string *)&data);
    __cxa_throw(this_00,&IllegalStateException::typeinfo,std::logic_error::~logic_error);
  }
  BloomFilter<supermap::Key<1ul>>::serialize_abi_cxx11_(&data,this,value);
  pXVar1 = (this->seeds_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pXVar2 = (this->seeds_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start; pXVar2 != pXVar1; pXVar2 = pXVar2 + 1) {
    __n = getHashWithSeed(this,&data,*pXVar2);
    rVar3 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->elements_,__n);
    *rVar3._M_p = *rVar3._M_p | rVar3._M_mask;
  }
  std::__cxx11::string::~string((string *)&data);
  return;
}

Assistant:

void add(const T &value) override {
        if (elements_.empty()) {
            throw supermap::IllegalStateException("Filter size was not reserved or was set to zero");
        }
        std::string data = serialize(value);
        for (auto &seed : seeds_) {
            std::uint64_t index = getHashWithSeed(data, seed);
            elements_[index] = true;
        }
    }